

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_concat(lua_State *L,int n)

{
  StkId pTVar1;
  int iVar2;
  TString *pTVar3;
  TString *x_;
  TValue *io;
  int n_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5ec,"void lua_concat(lua_State *, int)");
  }
  if ((long)L->top - (long)L->ci->func >> 4 <= (long)n) {
    __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5ed,"void lua_concat(lua_State *, int)");
  }
  if (n < 2) {
    if (n == 0) {
      pTVar1 = L->top;
      pTVar3 = luaS_newlstr(L,"",0);
      if (9 < (pTVar3->tt & 0xf)) {
        __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x5f2,"void lua_concat(lua_State *, int)");
      }
      (pTVar1->value_).gc = (GCObject *)pTVar3;
      pTVar1->tt_ = pTVar3->tt | 0x8000;
      if ((pTVar1->tt_ & 0x8000) != 0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x5f2,"void lua_concat(lua_State *, int)");
        }
        if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0011ed41:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x5f2,"void lua_concat(lua_State *, int)");
        }
        if (L != (lua_State *)0x0) {
          if ((pTVar1->tt_ & 0x8000) == 0) {
            __assert_fail("(((io)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x5f2,"void lua_concat(lua_State *, int)");
          }
          if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_0011ed41;
        }
      }
      L->top = L->top + 1;
      if (L->ci->top < L->top) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x5f3,"void lua_concat(lua_State *, int)");
      }
    }
  }
  else {
    luaV_concat(L,n);
  }
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x5f7,"void lua_concat(lua_State *, int)");
}

Assistant:

LUA_API void lua_concat (lua_State *L, int n) {
  lua_lock(L);
  api_checknelems(L, n);
  if (n >= 2) {
    luaV_concat(L, n);
  }
  else if (n == 0) {  /* push empty string */
    setsvalue2s(L, L->top, luaS_newlstr(L, "", 0));
    api_incr_top(L);
  }
  /* else n == 1; nothing to do */
  luaC_checkGC(L);
  lua_unlock(L);
}